

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::draw_frame(Application *this)

{
  initializer_list<VkClearValue> __l;
  bool bVar1;
  uint32_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *this_00;
  CommandBuffer *in_RDI;
  shared_ptr<myvk::CommandBuffer> *command_buffer;
  uint32_t current_frame;
  uint32_t image_index;
  uint32_t in_stack_00000124;
  Ptr<CommandBuffer> *in_stack_00000128;
  ImGuiRenderer *in_stack_00000130;
  FrameManager *in_stack_00000140;
  uint32_t in_stack_00000194;
  shared_ptr<myvk::CommandBuffer> *in_stack_00000198;
  PathTracerViewer *in_stack_000001a0;
  uint32_t in_stack_000001f4;
  shared_ptr<myvk::CommandBuffer> *in_stack_000001f8;
  undefined4 in_stack_00000200;
  uint32_t in_stack_00000204;
  shared_ptr<myvk::CommandBuffer> *in_stack_00000208;
  OctreeTracer *in_stack_00000210;
  VkSubpassContents in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff78;
  VkCommandPoolResetFlags flags;
  CommandPool *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  VkCommandBufferUsageFlags usage;
  allocator_type *in_stack_ffffffffffffff98;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  VkSubpassContents subpass_contents;
  undefined4 uVar6;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 uVar7;
  Camera *in_stack_ffffffffffffffc0;
  Ptr<Framebuffer> *framebuffer;
  FrameManager *in_stack_ffffffffffffffc8;
  Ptr<RenderPass> *render_pass;
  CommandBuffer *in_stack_ffffffffffffffd0;
  
  usage = (VkCommandBufferUsageFlags)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  flags = (VkCommandPoolResetFlags)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11bca8);
  bVar1 = myvk::FrameManager::NewFrame(in_stack_ffffffffffffffc8);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bcca);
    uVar2 = myvk::FrameManager::GetCurrentImageIndex(peVar3);
    peVar3 = std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bcea);
    myvk::FrameManager::GetCurrentFrame(peVar3);
    if (*(int *)&in_RDI[7].m_command_pool_ptr.
                 super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == 1) {
      std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11bd1a);
      Camera::UpdateFrameUniformBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11bd3a);
    myvk::FrameManager::GetCurrentCommandBuffer((FrameManager *)0x11bd42);
    peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bd57);
    myvk::CommandBuffer::GetCommandPoolPtr(peVar4);
    std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11bd67);
    myvk::CommandPool::Reset(in_stack_ffffffffffffff80,flags);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bd7e);
    myvk::CommandBuffer::Begin(in_RDI,usage);
    if (*(int *)&in_RDI[7].m_command_pool_ptr.
                 super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != 2) {
      std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11bda7);
      bVar1 = Octree::Empty((Octree *)0x11bdaf);
      if (!bVar1) {
        std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x11bdc4);
        OctreeTracer::CmdBeamRenderPass(in_stack_00000210,in_stack_00000208,in_stack_00000204);
      }
    }
    peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bde8);
    this_00 = (vector<VkClearValue,_std::allocator<VkClearValue>_> *)
              std::
              vector<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
              ::operator[]((vector<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
                            *)&in_RDI[3].m_command_pool_ptr,(ulong)uVar2);
    uVar5 = 0;
    subpass_contents = VK_SUBPASS_CONTENTS_INLINE;
    uVar6 = 0;
    uVar7 = 0x3f800000;
    framebuffer = (Ptr<Framebuffer> *)&stack0xffffffffffffffb0;
    render_pass = (Ptr<RenderPass> *)0x1;
    std::allocator<VkClearValue>::allocator((allocator<VkClearValue> *)0x11be5c);
    __l._M_len._0_4_ = uVar5;
    __l._M_array = (iterator)in_stack_ffffffffffffffa8;
    __l._M_len._4_4_ = subpass_contents;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
              (in_stack_ffffffffffffffa0,__l,in_stack_ffffffffffffff98);
    myvk::CommandBuffer::CmdBeginRenderPass
              (in_stack_ffffffffffffffd0,render_pass,framebuffer,
               (vector<VkClearValue,_std::allocator<VkClearValue>_> *)CONCAT44(uVar7,uVar6),
               subpass_contents);
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::~vector(this_00);
    std::allocator<VkClearValue>::~allocator((allocator<VkClearValue> *)&stack0xffffffffffffffaf);
    if (*(int *)&in_RDI[7].m_command_pool_ptr.
                 super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == 2) {
      std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11bec8);
      PathTracerViewer::CmdDrawPipeline(in_stack_000001a0,in_stack_00000198,in_stack_00000194);
    }
    else {
      std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11bf29);
      bVar1 = Octree::Empty((Octree *)0x11bf31);
      if (!bVar1) {
        std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x11bf46);
        OctreeTracer::CmdDrawPipeline
                  ((OctreeTracer *)CONCAT44(in_stack_00000204,in_stack_00000200),in_stack_000001f8,
                   in_stack_000001f4);
      }
    }
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bf6c);
    myvk::CommandBuffer::CmdNextSubpass(peVar4,in_stack_ffffffffffffff6c);
    std::__shared_ptr_access<myvk::ImGuiRenderer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::ImGuiRenderer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bf87);
    myvk::ImGuiRenderer::CmdDrawPipeline(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bfab);
    myvk::CommandBuffer::CmdEndRenderPass((CommandBuffer *)0x11bfb3);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bfc0);
    myvk::CommandBuffer::End((CommandBuffer *)0x11bfc8);
    std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11bfd9);
    myvk::FrameManager::Render(in_stack_00000140);
  }
  return;
}

Assistant:

void Application::draw_frame() {
	if (!m_frame_manager->NewFrame())
		return;

	uint32_t image_index = m_frame_manager->GetCurrentImageIndex();
	uint32_t current_frame = m_frame_manager->GetCurrentFrame();
	if (m_ui_state == UIStates::kOctreeTracer)
		m_camera->UpdateFrameUniformBuffer(current_frame);

	const std::shared_ptr<myvk::CommandBuffer> &command_buffer = m_frame_manager->GetCurrentCommandBuffer();

	command_buffer->GetCommandPoolPtr()->Reset();
	command_buffer->Begin();

	if (m_ui_state != UIStates::kPathTracing && !m_octree->Empty()) {
		m_octree_tracer->CmdBeamRenderPass(command_buffer, current_frame);
	}
	command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffers[image_index], {{{0.0f, 0.0f, 0.0f, 1.0f}}});
	if (m_ui_state == UIStates::kPathTracing) {
		m_path_tracer_viewer->CmdDrawPipeline(command_buffer, current_frame);
	} else if (!m_octree->Empty()) {
		m_octree_tracer->CmdDrawPipeline(command_buffer, current_frame);
	}
	command_buffer->CmdNextSubpass();
	m_imgui_renderer->CmdDrawPipeline(command_buffer, current_frame);
	command_buffer->CmdEndRenderPass();
	command_buffer->End();

	m_frame_manager->Render();
}